

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  char *pcVar1;
  sqlite3_stmt *pSelect;
  int iVar2;
  int iVar3;
  sqlite3_int64 iDocid;
  uchar *zText;
  long lVar4;
  u32 *pnWord;
  bool bVar5;
  int local_64;
  int *local_60;
  u32 *local_58;
  int local_50;
  int local_4c;
  sqlite3_value *pRowid_local;
  sqlite3_stmt *local_40;
  sqlite3_value *local_38;
  
  local_60 = pnChng;
  local_58 = aSzDel;
  pRowid_local = pRowid;
  local_38 = pRowid;
  iVar2 = fts3SqlStmt(p,7,&local_40,&local_38);
  pSelect = local_40;
  if (iVar2 == 0) {
    local_50 = sqlite3_step(local_40);
    if (local_50 != 100) {
LAB_001bc815:
      iVar2 = local_50;
      local_64 = sqlite3_reset(pSelect);
      if (iVar2 != 100 || local_64 != 0) {
        return local_64;
      }
      if (p->zContentTbl == (char *)0x0) {
        local_38 = pRowid;
        iVar2 = fts3SqlStmt(p,1,&local_40,&local_38);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = sqlite3_step(local_40);
        bVar5 = true;
        if (iVar2 == 100) {
          iVar2 = sqlite3_column_int(local_40,0);
          bVar5 = iVar2 == 0;
        }
        local_64 = sqlite3_reset(local_40);
        if (local_64 != 0) {
          return local_64;
        }
        if (!bVar5) {
          local_64 = fts3DeleteAll(p,1);
          *local_60 = 0;
          memset(local_58,0,(long)p->nColumn * 8 + 8);
          return local_64;
        }
        pcVar1 = p->zContentTbl;
        *local_60 = *local_60 + -1;
        if (pcVar1 == (char *)0x0) {
          fts3SqlExec(&local_64,p,0,&pRowid_local);
        }
      }
      else {
        local_64 = 0;
        *local_60 = *local_60 + -1;
        local_38 = pRowid;
      }
      if (p->bHasDocsize == '\0') {
        return local_64;
      }
      fts3SqlExec(&local_64,p,0x13,&pRowid_local);
      return local_64;
    }
    iVar2 = langidFromSelect(p,pSelect);
    iDocid = sqlite3_column_int64(pSelect,0);
    local_4c = iVar2;
    iVar2 = fts3PendingTermsDocid(p,1,iVar2,iDocid);
    lVar4 = 1;
    pnWord = local_58;
    while (iVar2 == 0) {
      if (p->nColumn < lVar4) goto LAB_001bc815;
      iVar2 = 0;
      if (p->abNotindexed[lVar4 + -1] == '\0') {
        zText = sqlite3_column_text(pSelect,(int)lVar4);
        iVar2 = fts3PendingTermsAdd(p,local_4c,(char *)zText,-1,pnWord);
        iVar3 = sqlite3_column_bytes(pSelect,(int)lVar4);
        local_58[p->nColumn] = local_58[p->nColumn] + iVar3;
      }
      lVar4 = lVar4 + 1;
      pnWord = pnWord + 1;
    }
  }
  sqlite3_reset(pSelect);
  return iVar2;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p, 
  sqlite3_value *pRowid, 
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}